

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeSecureDelete(Btree *p,int newFlag)

{
  int in_ESI;
  long in_RDI;
  int b;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else {
    sqlite3BtreeEnter((Btree *)0x21e0b0);
    if (-1 < in_ESI) {
      *(ushort *)(*(long *)(in_RDI + 8) + 0x28) = *(ushort *)(*(long *)(in_RDI + 8) + 0x28) & 0xfff3
      ;
      *(ushort *)(*(long *)(in_RDI + 8) + 0x28) =
           *(ushort *)(*(long *)(in_RDI + 8) + 0x28) | (ushort)(in_ESI << 2);
    }
    local_4 = (*(ushort *)(*(long *)(in_RDI + 8) + 0x28) & 0xc) / 4;
    sqlite3BtreeLeave((Btree *)0x21e10a);
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSecureDelete(Btree *p, int newFlag){
  int b;
  if( p==0 ) return 0;
  sqlite3BtreeEnter(p);
  assert( BTS_OVERWRITE==BTS_SECURE_DELETE*2 );
  assert( BTS_FAST_SECURE==(BTS_OVERWRITE|BTS_SECURE_DELETE) );
  if( newFlag>=0 ){
    p->pBt->btsFlags &= ~BTS_FAST_SECURE;
    p->pBt->btsFlags |= BTS_SECURE_DELETE*newFlag;
  }
  b = (p->pBt->btsFlags & BTS_FAST_SECURE)/BTS_SECURE_DELETE;
  sqlite3BtreeLeave(p);
  return b;
}